

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

void __thiscall dg::vr::StructureAnalyzer::initializeCallRelations(StructureAnalyzer *this)

{
  CallBase *ptr;
  iterator __position;
  _Base_ptr p_Var1;
  char cVar2;
  long lVar3;
  VRLocation *pVVar4;
  op_iterator pUVar5;
  Argument *formalArg;
  Argument *pAVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  CallBase *pCVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>_>_>,_bool>
  pVar10;
  iterator_range<const_llvm::Argument_*> iVar11;
  Value *realArg;
  Argument *local_98;
  StructureAnalyzer *local_90;
  Argument *local_88;
  StructureAnalyzer *local_80;
  long local_78;
  long local_70;
  _Base_ptr *local_68;
  _Base_ptr local_60;
  long local_58;
  Argument *local_50;
  vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_> local_48;
  
  local_70 = *(long *)(*(long *)this + 0x20);
  local_78 = *(long *)this + 0x18;
  if (local_70 != local_78) {
    local_80 = this + 0xd0;
    local_90 = this;
    do {
      local_88 = (Argument *)(local_70 + -0x38);
      if (local_70 == 0) {
        local_88 = (Argument *)0x0;
      }
      cVar2 = llvm::GlobalValue::isDeclaration();
      pAVar6 = local_88;
      if (cVar2 == '\0') {
        local_98 = local_88;
        local_48.super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pVar10 = std::
                 _Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>,std::_Select1st<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>>
                 ::
                 _M_emplace_unique<llvm::Function_const*,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>
                           ((_Rb_tree<llvm::Function_const*,std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>,std::_Select1st<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>,std::less<llvm::Function_const*>,std::allocator<std::pair<llvm::Function_const*const,std::vector<dg::vr::CallRelation,std::allocator<dg::vr::CallRelation>>>>>
                             *)local_80,(Function **)&local_98,&local_48);
        std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>::~vector(&local_48)
        ;
        lVar3 = *(long *)(pAVar6 + 8);
        if (lVar3 != 0) {
          local_68 = &pVar10.first._M_node._M_node[1]._M_parent;
          local_60 = pVar10.first._M_node._M_node;
          do {
            p_Var1 = local_60;
            ptr = *(CallBase **)(lVar3 + 0x18);
            local_58 = lVar3;
            if ((ptr != (CallBase *)0x0) && (ptr[0x10] == (CallBase)0x53)) {
              __position._M_current = (CallRelation *)local_60[1]._M_left;
              if ((_Base_ptr)__position._M_current == local_60[1]._M_right) {
                std::vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>::
                _M_realloc_insert<>((vector<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>
                                     *)local_68,__position);
                p_Var7 = p_Var1[1]._M_left;
              }
              else {
                ((__position._M_current)->equalPairs).
                super__Vector_base<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                (__position._M_current)->callSite = (VRLocation *)0x0;
                ((__position._M_current)->equalPairs).
                super__Vector_base<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                ((__position._M_current)->equalPairs).
                super__Vector_base<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Argument_*,_const_llvm::Value_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                p_Var7 = local_60[1]._M_left + 1;
                local_60[1]._M_left = p_Var7;
              }
              pVVar4 = VRCodeGraph::getVRLocation
                                 (*(VRCodeGraph **)(local_90 + 8),(Instruction *)ptr);
              p_Var7[-1]._M_right = (_Base_ptr)pVVar4;
              iVar11 = llvm::Function::args((Function *)local_88);
              local_50 = iVar11.end_iterator;
              if (iVar11.begin_iterator != local_50) {
                uVar8 = 0xffffffffffffffff;
                pCVar9 = ptr;
                do {
                  local_50 = iVar11.end_iterator;
                  pUVar5 = llvm::CallBase::arg_end(ptr);
                  uVar8 = uVar8 + 1;
                  if (((ulong)((long)pUVar5 -
                              (long)(ptr + (ulong)-(*(uint *)(ptr + 0x14) & 0x7ffffff) * 0x20)) >> 5
                      & 0xffffffff) <= uVar8) break;
                  local_48.
                  super__Vector_base<dg::vr::CallRelation,_std::allocator<dg::vr::CallRelation>_>.
                  _M_impl.super__Vector_impl_data._M_start =
                       *(pointer *)(pCVar9 + -(ulong)((*(uint *)(ptr + 0x14) & 0x7ffffff) << 5));
                  local_98 = iVar11.begin_iterator;
                  std::
                  vector<std::pair<llvm::Argument_const*,llvm::Value_const*>,std::allocator<std::pair<llvm::Argument_const*,llvm::Value_const*>>>
                  ::emplace_back<llvm::Argument_const*,llvm::Value_const*&>
                            ((vector<std::pair<llvm::Argument_const*,llvm::Value_const*>,std::allocator<std::pair<llvm::Argument_const*,llvm::Value_const*>>>
                              *)(p_Var7 + -1),&local_98,(Value **)&local_48);
                  pAVar6 = iVar11.begin_iterator + 0x28;
                  iVar11.end_iterator = local_50;
                  iVar11.begin_iterator = pAVar6;
                  pCVar9 = pCVar9 + 0x20;
                } while (pAVar6 != local_50);
              }
            }
            lVar3 = *(long *)(local_58 + 8);
          } while (lVar3 != 0);
        }
      }
      local_70 = *(long *)(local_70 + 8);
    } while (local_70 != local_78);
  }
  return;
}

Assistant:

void StructureAnalyzer::initializeCallRelations() {
    for (const llvm::Function &function : module) {
        if (function.isDeclaration())
            continue;

        auto pair = callRelationsMap.emplace(&function,
                                             std::vector<CallRelation>());

        // for each location, where the function is called
        for (const llvm::Value *user : function.users()) {
            // get call from user
            const llvm::CallInst *call = llvm::dyn_cast<llvm::CallInst>(user);
            if (!call)
                continue;

            std::vector<CallRelation> &callRelations = pair.first->second;

            callRelations.emplace_back();
            CallRelation &callRelation = callRelations.back();

            // set pointer to the location from which the function is called
            callRelation.callSite = &codeGraph.getVRLocation(call);

            // set formal parameters equal to real
            unsigned argCount = 0;
            for (const llvm::Argument &formalArg : function.args()) {
                if (argCount >= llvmutils::getNumArgOperands(call))
                    break;
                const llvm::Value *realArg = call->getArgOperand(argCount);

                callRelation.equalPairs.emplace_back(&formalArg, realArg);
                ++argCount;
            }
        }
    }
}